

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O2

ByteData256 *
cfd::CollectSighashByTx
          (ByteData256 *__return_storage_ptr__,Transaction *transaction,OutPoint *outpoint,
          UtxoData *utxo,SigHashType *sighash_type,Pubkey *pubkey,Script *redeem_script,
          WitnessVersion witness_version,ByteData *param_8,TaprootScriptTree *param_9)

{
  bool bVar1;
  uint32_t uVar2;
  Script script_data;
  SigHashType local_ac;
  Script local_a0;
  Script local_68;
  
  core::OutPoint::GetTxid((Txid *)&local_a0,outpoint);
  uVar2 = core::OutPoint::GetVout(outpoint);
  uVar2 = (*(transaction->super_AbstractTransaction)._vptr_AbstractTransaction[2])
                    (transaction,&local_a0,(ulong)uVar2);
  core::Txid::~Txid((Txid *)&local_a0);
  core::Script::Script(&local_a0,redeem_script);
  bVar1 = core::Script::IsEmpty(&local_a0);
  if (bVar1) {
    core::ScriptUtil::CreateP2pkhLockingScript(&local_68,pubkey);
    core::Script::operator=(&local_a0,&local_68);
    core::Script::~Script(&local_68);
  }
  core::Script::GetData((ByteData *)&local_68,&local_a0);
  core::SigHashType::SigHashType(&local_ac,sighash_type);
  core::Transaction::GetSignatureHash
            (__return_storage_ptr__,transaction,uVar2,(ByteData *)&local_68,&local_ac,&utxo->amount,
             witness_version);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68);
  core::Script::~Script(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

static ByteData256 CollectSighashByTx(
    const Transaction* transaction, const OutPoint& outpoint,
    const UtxoData& utxo, const SigHashType& sighash_type,
    const Pubkey& pubkey, const Script& redeem_script,
    WitnessVersion witness_version, const ByteData*,
    const TaprootScriptTree*) {
  uint32_t index =
      transaction->GetTxInIndex(outpoint.GetTxid(), outpoint.GetVout());
  Script script_data = redeem_script;
  if (script_data.IsEmpty()) {
    script_data = ScriptUtil::CreateP2pkhLockingScript(pubkey);
  }
  auto sighash = transaction->GetSignatureHash(
      index, script_data.GetData(), sighash_type, utxo.amount,
      witness_version);
  return sighash;
}